

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar *text_begin;
  unsigned_short *puVar1;
  bool bVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  uint uVar6;
  undefined1 in_R8B;
  int iVar7;
  uint uVar8;
  uint line_start_idx;
  int char_idx;
  float fVar9;
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  float fVar11;
  ImWchar *local_38;
  
  uVar6 = str->CurLenW;
  bVar2 = 0 < (int)uVar6;
  if ((int)uVar6 < 1) {
    line_start_idx = 0;
    auVar10 = ZEXT1264(ZEXT412(0));
    iVar7 = 0;
  }
  else {
    fVar11 = 0.0;
    line_start_idx = 0;
    do {
      puVar1 = (str->TextW).Data;
      local_38 = (ImWchar *)0x0;
      text_begin = puVar1 + (int)line_start_idx;
      auVar10._0_8_ =
           InputTextCalcTextSizeW
                     (text_begin,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,(bool)in_R8B);
      auVar10._8_56_ = extraout_var;
      iVar7 = (int)((ulong)((long)local_38 - (long)text_begin) >> 1);
      if (iVar7 < 1) {
        return uVar6;
      }
      if ((y < fVar11) && (line_start_idx == 0)) {
        return 0;
      }
      auVar4 = vmovshdup_avx(auVar10._0_16_);
      fVar11 = fVar11 + auVar4._0_4_;
      if (y < fVar11) break;
      line_start_idx = line_start_idx + iVar7;
      bVar2 = (int)line_start_idx < (int)uVar6;
    } while ((int)line_start_idx < (int)uVar6);
  }
  uVar8 = uVar6;
  if ((bVar2) && (uVar8 = line_start_idx, 0.0 <= x)) {
    if ((x < auVar10._0_4_) && (0 < iVar7)) {
      char_idx = 0;
      fVar11 = 0.0;
      do {
        fVar9 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,char_idx);
        fVar3 = fVar11 + fVar9;
        fVar5 = fVar3;
        if (x < fVar3) {
          uVar6 = line_start_idx + 1;
          if (x < fVar11 + fVar9 * 0.5) {
            uVar6 = line_start_idx;
          }
          uVar6 = uVar6 + char_idx;
          fVar5 = fVar11;
        }
        if (x < fVar3) {
          return uVar6;
        }
        char_idx = char_idx + 1;
        fVar11 = fVar5;
      } while (iVar7 != char_idx);
    }
    uVar8 = iVar7 + line_start_idx;
    if ((uVar8 == 0 || SCARRY4(iVar7,line_start_idx) != (int)uVar8 < 0) ||
       ((str->TextW).Size < (int)uVar8)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66b,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    if ((str->TextW).Data[uVar8 - 1] == 10) {
      uVar8 = uVar8 - 1;
    }
  }
  return uVar8;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}